

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O1

void __thiscall xray_re::xr_scene_lights::load(xr_scene_lights *this,xr_reader *r)

{
  uint8_t *puVar1;
  float *pfVar2;
  pointer pxVar3;
  uint32_t *puVar4;
  int iVar5;
  size_t sVar6;
  pointer pxVar7;
  uint32_t count;
  uint16_t version;
  uint local_20;
  short local_1a;
  
  xr_reader::r_raw_chunk(r,0x1001,&local_1a,2);
  if (local_1a != 0) {
    __assert_fail("version == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0xb2,"virtual void xray_re::xr_scene_lights::load(xr_reader &)");
  }
  xr_scene_objects::load(&this->super_xr_scene_objects,r);
  xr_reader::r_raw_chunk(r,0x1004,&this->m_flags,4);
  sVar6 = xr_reader::find_chunk(r,0x1006);
  if (sVar6 != 0) {
    puVar1 = (r->field_2).m_p;
    (r->field_2).m_p = puVar1 + 5;
    (this->m_sun).field_0.field_0.x = *(float *)(puVar1 + 1);
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_sun).field_0.field_0.y = *pfVar2;
  }
  local_20 = 0;
  xr_reader::r_raw_chunk(r,0x1003,&local_20,4);
  sVar6 = xr_reader::find_chunk(r,0x1002);
  if (sVar6 != 0) {
    pxVar7 = (this->m_controls).
             super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>._M_impl.
             super__Vector_impl_data._M_start;
    pxVar3 = (this->m_controls).
             super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)pxVar3 - (long)pxVar7 >> 3) * -0x3333333333333333 - (ulong)local_20 != 0) {
      __assert_fail("count == m_controls.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                    ,0xbe,"virtual void xray_re::xr_scene_lights::load(xr_reader &)");
    }
    for (; pxVar7 != pxVar3; pxVar7 = pxVar7 + 1) {
      xr_reader::skip_sz(r);
      iVar5 = std::__cxx11::string::compare((char *)pxVar7);
      if (iVar5 != 0) {
        __assert_fail("name == it->name",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                      ,0xc2,"virtual void xray_re::xr_scene_lights::load(xr_reader &)");
      }
      puVar4 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
      pxVar7->id = *puVar4;
    }
  }
  return;
}

Assistant:

void xr_scene_lights::load(xr_reader& r)
{
	uint16_t version;
	r.r_chunk<uint16_t>(TOOLS_CHUNK_VERSION, version);
	xr_assert(version == 0);
	xr_scene_objects::load(r);
	r.r_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_FLAGS, m_flags);
	if (r.find_chunk(LIGHTS_CHUNK_COMMON_SUN)) {
		r.r_u8();
		r.r_fvector2(m_sun);
		r.debug_find_chunk();
	}

	uint32_t count = 0;
	r.r_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_COUNT, count);
	if (r.find_chunk(LIGHTS_CHUNK_COMMON_CONTROLS)) {
		xr_assert(count == m_controls.size());
		for (xr_token_vec_it it = m_controls.begin(), end = m_controls.end();
				it != end; ++it) {
			const char* name = r.skip_sz();
			xr_assert(name == it->name);
			it->id = r.r_u32();
		}
		r.debug_find_chunk();
	}
}